

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instancenorm.cpp
# Opt level: O2

int __thiscall
ncnn::InstanceNorm::forward_inplace(InstanceNorm *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  int i;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 in_XMM2 [16];
  undefined1 auVar10 [16];
  Mat local_78;
  
  uVar4 = bottom_top_blob->h * bottom_top_blob->w;
  uVar6 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar6;
  }
  uVar3 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar3 = uVar6;
  }
  for (; uVar6 != uVar3; uVar6 = uVar6 + 1) {
    Mat::channel(&local_78,bottom_top_blob,(int)uVar6);
    pvVar1 = local_78.data;
    Mat::~Mat(&local_78);
    fVar7 = 0.0;
    for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
      fVar7 = fVar7 + *(float *)((long)pvVar1 + uVar2 * 4);
    }
    fVar7 = fVar7 * (1.0 / (float)(int)uVar4);
    fVar8 = 0.0;
    for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
      fVar9 = *(float *)((long)pvVar1 + uVar2 * 4) - fVar7;
      fVar9 = fVar9 * fVar9;
      in_XMM2 = ZEXT416((uint)fVar9);
      fVar8 = fVar8 + fVar9;
    }
    fVar8 = fVar8 * (1.0 / (float)(int)uVar4);
    if (this->affine == 0) {
      fVar8 = fVar8 + this->eps;
      auVar10 = rsqrtss(in_XMM2,ZEXT416((uint)fVar8));
      fVar9 = auVar10._0_4_;
      in_XMM2._4_12_ = auVar10._4_12_;
      in_XMM2._0_4_ = fVar9 * -0.5 * (fVar8 * fVar9 * fVar9 + -3.0);
      fVar7 = -fVar7 * in_XMM2._0_4_;
    }
    else {
      fVar8 = fVar8 + this->eps;
      auVar10 = rsqrtss(in_XMM2,ZEXT416((uint)fVar8));
      fVar9 = auVar10._0_4_;
      in_XMM2._4_12_ = auVar10._4_12_;
      in_XMM2._0_4_ =
           fVar9 * -0.5 * (fVar8 * fVar9 * fVar9 + -3.0) *
           *(float *)((long)(this->gamma_data).data + uVar6 * 4);
      fVar7 = *(float *)((long)(this->beta_data).data + uVar6 * 4) - fVar7 * in_XMM2._0_4_;
    }
    for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
      *(float *)((long)pvVar1 + uVar2 * 4) =
           *(float *)((long)pvVar1 + uVar2 * 4) * in_XMM2._0_4_ + fVar7;
    }
  }
  return 0;
}

Assistant:

int InstanceNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / (sqrt(var + eps)) * gamma + beta

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int c = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < c; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        // mean and var
        float sum = 0.f;
        float sqsum = 0.f;
        for (int i = 0; i < size; i++)
        {
            sum += ptr[i];
            //sqsum += ptr[i] * ptr[i];
        }
        float mean = sum / size;
        float tmp = 0.f;
        for (int i = 0; i < size; i++)
        {
            tmp = ptr[i] - mean;
            sqsum += tmp * tmp;
        }
        float var = sqsum / size;
        // the var maybe minus due to accuracy
        //float var = sqsum / size - mean * mean;

        float a;
        float b;
        if (affine)
        {
            float gamma = gamma_data[q];
            float beta = beta_data[q];

            a = static_cast<float>(gamma / (sqrt(var + eps)));
            b = -mean * a + beta;
        }
        else
        {
            a = static_cast<float>(1.f / (sqrt(var + eps)));
            b = -mean * a;
        }

        for (int i = 0; i < size; i++)
        {
            ptr[i] = ptr[i] * a + b;
        }
    }

    return 0;
}